

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.h
# Opt level: O2

FArchive * operator<<(FArchive *arc,TArray<DInterpolation_*,_DInterpolation_*> *self)

{
  DWORD amount;
  uint i;
  ulong uVar1;
  long lVar2;
  
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,self->Count);
  }
  else {
    amount = FArchive::ReadCount(arc);
    TArray<DInterpolation_*,_DInterpolation_*>::Resize(self,amount);
  }
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < self->Count; uVar1 = uVar1 + 1) {
    operator<<(arc,(DInterpolation **)((long)self->Array + lVar2));
    lVar2 = lVar2 + 8;
  }
  return arc;
}

Assistant:

inline FArchive &operator<< (FArchive &arc, TArray<T,TT> &self)
{
	if (arc.IsStoring())
	{
		arc.WriteCount(self.Count);
	}
	else
	{
		DWORD numStored = arc.ReadCount();
		self.Resize(numStored);
	}
	for (unsigned int i = 0; i < self.Count; ++i)
	{
		arc << self.Array[i];
	}
	return arc;
}